

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

void __thiscall tl::StrT<char>::StrT(StrT<char> *this,u32 size,char c)

{
  ulong uVar1;
  
  this->_str = &s_emptyStr<char>;
  this->_size = 0;
  resizeNoCopy(this,size);
  if (this->_size != 0) {
    uVar1 = 0;
    do {
      this->_str[uVar1] = c;
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->_size);
  }
  return;
}

Assistant:

StrT<CharT>::StrT(u32 size, CharT c)
    : StrT()
{
    resizeNoCopy(size);
    for(u32 i=0; i<_size; i++) {
        _str[i] = c;
    }
}